

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall
llvm::yaml::Scanner::Scanner
          (Scanner *this,MemoryBufferRef Buffer,SourceMgr *SM_,bool ShowColors,error_code *EC)

{
  error_code *EC_local;
  bool ShowColors_local;
  SourceMgr *SM__local;
  Scanner *this_local;
  
  this->SM = SM_;
  MemoryBufferRef::MemoryBufferRef(&this->InputBuffer);
  this->ShowColors = ShowColors;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::AllocatorList(&this->TokenQueue);
  SmallVector<int,_4U>::SmallVector(&this->Indents);
  SmallVector<(anonymous_namespace)::SimpleKey,_4U>::SmallVector(&this->SimpleKeys);
  this->EC = EC;
  init(this,(EVP_PKEY_CTX *)SM_);
  return;
}

Assistant:

Scanner::Scanner(MemoryBufferRef Buffer, SourceMgr &SM_, bool ShowColors,
                 std::error_code *EC)
    : SM(SM_), ShowColors(ShowColors), EC(EC) {
  init(Buffer);
}